

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void lowbd_inv_txfm2d_add_no_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined4 *puVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  transform_1d_ssse3 p_Var6;
  transform_1d_ssse3 p_Var7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined2 uVar38;
  longlong lVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  __m128i *palVar54;
  undefined1 *puVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [16];
  int iVar58;
  long lVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  ulong uVar62;
  ulong uVar63;
  uint uVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar67;
  undefined7 in_register_00000081;
  uint uVar68;
  __m128i *palVar69;
  uint uVar70;
  long lVar71;
  ulong uVar72;
  undefined1 *puVar73;
  bool bVar74;
  undefined4 uVar75;
  undefined1 auVar77 [12];
  undefined1 auVar78 [16];
  __m128i alVar79;
  undefined1 auVar81 [16];
  undefined4 uVar82;
  undefined1 auVar84 [12];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  undefined4 uVar107;
  undefined1 auVar109 [12];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined4 uVar124;
  undefined1 auVar126 [12];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  __m128i temp [8];
  __m128i buf0 [64];
  __m128i buf1 [512];
  int local_2540;
  byte local_2514;
  ulong local_24c8;
  undefined1 (*local_24c0 [3]) [16];
  undefined2 local_24a8;
  undefined2 uStack_24a6;
  undefined2 uStack_24a4;
  undefined2 uStack_24a2;
  undefined2 uStack_24a0;
  undefined2 uStack_249e;
  undefined2 uStack_249c;
  undefined2 uStack_249a;
  undefined1 local_2498 [16];
  undefined2 local_2488;
  undefined2 uStack_2486;
  undefined2 uStack_2484;
  undefined2 uStack_2482;
  undefined2 uStack_2480;
  undefined2 uStack_247e;
  undefined2 uStack_247c;
  undefined2 uStack_247a;
  undefined1 local_2478 [16];
  undefined2 local_2468;
  undefined2 uStack_2466;
  undefined2 uStack_2464;
  undefined2 uStack_2462;
  undefined2 uStack_2460;
  undefined2 uStack_245e;
  undefined2 uStack_245c;
  undefined2 uStack_245a;
  undefined1 local_2458 [16];
  undefined2 local_2448;
  undefined2 uStack_2446;
  undefined2 uStack_2444;
  undefined2 uStack_2442;
  undefined2 uStack_2440;
  undefined2 uStack_243e;
  undefined2 uStack_243c;
  undefined2 uStack_243a;
  longlong local_2438 [2];
  undefined2 auStack_2428 [8];
  undefined1 auStack_2418 [16];
  undefined2 auStack_2408 [8];
  undefined1 auStack_23f8 [16];
  undefined2 auStack_23e8 [8];
  undefined1 auStack_23d8 [16];
  undefined2 auStack_23c8 [456];
  longlong local_2038 [4];
  undefined4 local_2018 [8];
  undefined8 local_1ff8;
  undefined8 auStack_1ff0 [3];
  undefined4 local_1fd8 [4];
  undefined1 local_1fc8 [8];
  undefined4 auStack_1fc0 [2020];
  undefined1 auVar76 [12];
  undefined1 auVar80 [16];
  undefined1 auVar83 [12];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [12];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [12];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  
  local_2540 = 0;
  uVar63 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  uVar70 = 0;
  iVar58 = 0;
  if (eob != 1) {
    uVar70 = (int)av1_eob_to_eobxy_default[uVar63]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + uVar63) & 0x1f)] & 0xff;
    iVar58 = (int)av1_eob_to_eobxy_default[uVar63]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + uVar63) & 0x1f)] >> 8;
  }
  uVar56 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) * 4);
  uVar3 = *(uint *)((long)tx_size_wide + uVar56);
  uVar4 = *(uint *)((long)tx_size_high + uVar56);
  uVar72 = (ulong)uVar4;
  uVar68 = (int)uVar3 >> 3;
  uVar66 = iVar58 + 8 >> 3;
  uVar64 = 0x20;
  if ((int)uVar4 < 0x20) {
    uVar64 = uVar4;
  }
  if (uVar3 != uVar4) {
    if ((int)uVar4 < (int)uVar3) {
      local_2540 = 1;
      if ((uVar4 * 2 == uVar3) || (local_2540 = 2, uVar4 * 4 == uVar3)) goto LAB_0039a9ac;
    }
    else {
      local_2540 = -1;
      if ((uVar3 * 2 == uVar4) || (local_2540 = -2, uVar3 * 4 == uVar4)) goto LAB_0039a9ac;
    }
    local_2540 = 0;
  }
LAB_0039a9ac:
  pcVar5 = av1_inv_txfm_shift_ls[uVar63];
  lVar60 = (long)(int)uVar4;
  bVar74 = 0xf < tx_type;
  uVar67 = 0xbeaf >> (tx_type & 0x1f);
  p_Var6 = lowbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar56) + -2]
           [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[iVar58]];
  uVar63 = (ulong)uVar68;
  if (0 < (int)uVar66) {
    p_Var7 = lowbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_wide_log2 + uVar56) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[uVar70]];
    lVar71 = (ulong)((uVar70 & 0xffffff8) << 4) + 0x80;
    pauVar61 = (undefined1 (*) [16])(input + 4);
    puVar73 = local_1fc8;
    uVar56 = 0;
    do {
      lVar59 = 0;
      pauVar57 = pauVar61;
      do {
        auVar78 = packssdw(pauVar57[-1],*pauVar57);
        *(undefined1 (*) [16])((long)local_2438 + lVar59) = auVar78;
        lVar59 = lVar59 + 0x10;
        pauVar57 = (undefined1 (*) [16])(*pauVar57 + (long)(int)uVar64 * 4);
      } while (lVar71 != lVar59);
      if ((local_2540 == 1) || (local_2540 == -1)) {
        lVar59 = 0;
        do {
          auVar78 = pmulhrsw(*(undefined1 (*) [16])((long)local_2438 + lVar59),_DAT_00526850);
          *(undefined1 (*) [16])((long)local_2438 + lVar59) = auVar78;
          lVar59 = lVar59 + 0x10;
        } while (lVar71 != lVar59);
      }
      local_24c8 = uVar56;
      local_24c0[0] = pauVar61;
      (*p_Var7)(&local_2438,&local_2438);
      cVar2 = *pcVar5;
      if (cVar2 < 0) {
        auVar78 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
        auVar78 = pshuflw(auVar78,auVar78,0);
        auVar78._4_4_ = auVar78._0_4_;
        auVar78._8_4_ = auVar78._0_4_;
        auVar78._12_4_ = auVar78._0_4_;
        palVar54 = &local_2438;
        uVar62 = (ulong)uVar3;
        do {
          alVar79 = (__m128i)pmulhrsw((undefined1  [16])*palVar54,auVar78);
          *palVar54 = alVar79;
          palVar54 = palVar54 + 1;
          uVar62 = uVar62 - 1;
        } while (uVar62 != 0);
      }
      else {
        palVar54 = &local_2438;
        uVar62 = (ulong)uVar3;
        if (cVar2 != '\0') {
          do {
            alVar79 = (__m128i)psllw((undefined1  [16])*palVar54,ZEXT416((uint)(int)cVar2));
            *palVar54 = alVar79;
            uVar62 = uVar62 - 1;
            palVar54 = palVar54 + 1;
          } while (uVar62 != 0);
        }
      }
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && !bVar74) {
        if (0 < (int)uVar68) {
          uVar62 = 0;
          palVar54 = &local_2438;
          do {
            lVar59 = 0x80;
            palVar69 = palVar54;
            do {
              lVar39 = (*palVar69)[1];
              *(longlong *)((long)local_24c0 + lVar59 + -8) = (*palVar69)[0];
              *(longlong *)((long)local_24c0 + lVar59) = lVar39;
              palVar69 = palVar69 + 1;
              lVar59 = lVar59 + -0x10;
            } while (lVar59 != 0);
            lVar59 = (~uVar62 + (long)(int)uVar68) * lVar60;
            auVar96._0_12_ = local_24c0._8_12_;
            auVar96._12_2_ = local_24c0[1]._6_2_;
            auVar96._14_2_ = uStack_24a2;
            auVar95._12_4_ = auVar96._12_4_;
            auVar95._0_10_ = local_24c0._8_10_;
            auVar95._10_2_ = uStack_24a4;
            auVar94._10_6_ = auVar95._10_6_;
            auVar94._0_8_ = local_24c0[1];
            auVar94._8_2_ = local_24c0[1]._4_2_;
            auVar44._4_8_ = auVar94._8_8_;
            auVar44._2_2_ = uStack_24a6;
            auVar44._0_2_ = local_24c0[1]._2_2_;
            auVar93._0_4_ = CONCAT22(local_24a8,(short)local_24c0[1]);
            auVar93._4_12_ = auVar44;
            auVar121._0_12_ = local_2498._0_12_;
            auVar121._12_2_ = local_2498._6_2_;
            auVar121._14_2_ = uStack_2482;
            auVar120._12_4_ = auVar121._12_4_;
            auVar120._0_10_ = local_2498._0_10_;
            auVar120._10_2_ = uStack_2484;
            auVar119._10_6_ = auVar120._10_6_;
            auVar119._0_8_ = local_2498._0_8_;
            auVar119._8_2_ = local_2498._4_2_;
            auVar45._4_8_ = auVar119._8_8_;
            auVar45._2_2_ = uStack_2486;
            auVar45._0_2_ = local_2498._2_2_;
            auVar106._0_12_ = local_2478._0_12_;
            auVar106._12_2_ = local_2478._6_2_;
            auVar106._14_2_ = uStack_2462;
            auVar105._12_4_ = auVar106._12_4_;
            auVar105._0_10_ = local_2478._0_10_;
            auVar105._10_2_ = uStack_2464;
            auVar104._10_6_ = auVar105._10_6_;
            auVar104._0_8_ = local_2478._0_8_;
            auVar104._8_2_ = local_2478._4_2_;
            auVar46._4_8_ = auVar104._8_8_;
            auVar46._2_2_ = uStack_2466;
            auVar46._0_2_ = local_2478._2_2_;
            auVar103._0_4_ = CONCAT22(local_2468,local_2478._0_2_);
            auVar103._4_12_ = auVar46;
            auVar136._0_12_ = local_2458._0_12_;
            auVar136._12_2_ = local_2458._6_2_;
            auVar136._14_2_ = uStack_2442;
            auVar135._12_4_ = auVar136._12_4_;
            auVar135._0_10_ = local_2458._0_10_;
            auVar135._10_2_ = uStack_2444;
            auVar134._10_6_ = auVar135._10_6_;
            auVar134._0_8_ = local_2458._0_8_;
            auVar134._8_2_ = local_2458._4_2_;
            auVar47._4_8_ = auVar134._8_8_;
            auVar47._2_2_ = uStack_2446;
            auVar47._0_2_ = local_2458._2_2_;
            uVar75 = CONCAT22(uStack_24a0,(short)local_24c0[2]);
            auVar77._0_8_ = CONCAT26(uStack_249e,CONCAT24(local_24c0[2]._2_2_,uVar75));
            auVar77._8_2_ = local_24c0[2]._4_2_;
            auVar77._10_2_ = uStack_249c;
            auVar98._12_2_ = local_24c0[2]._6_2_;
            auVar98._0_12_ = auVar77;
            auVar98._14_2_ = uStack_249a;
            uVar107 = CONCAT22(uStack_2480,local_2498._8_2_);
            auVar109._0_8_ = CONCAT26(uStack_247e,CONCAT24(local_2498._10_2_,uVar107));
            auVar109._8_2_ = local_2498._12_2_;
            auVar109._10_2_ = uStack_247c;
            auVar111._12_2_ = local_2498._14_2_;
            auVar111._0_12_ = auVar109;
            auVar111._14_2_ = uStack_247a;
            uVar82 = CONCAT22(uStack_2460,local_2478._8_2_);
            auVar84._0_8_ = CONCAT26(uStack_245e,CONCAT24(local_2478._10_2_,uVar82));
            auVar84._8_2_ = local_2478._12_2_;
            auVar84._10_2_ = uStack_245c;
            auVar86._12_2_ = local_2478._14_2_;
            auVar86._0_12_ = auVar84;
            auVar86._14_2_ = uStack_245a;
            uVar124 = CONCAT22(uStack_2440,local_2458._8_2_);
            auVar126._0_8_ = CONCAT26(uStack_243e,CONCAT24(local_2458._10_2_,uVar124));
            auVar126._8_2_ = local_2458._12_2_;
            auVar126._10_2_ = uStack_243c;
            auVar128._12_2_ = local_2458._14_2_;
            auVar128._0_12_ = auVar126;
            auVar128._14_2_ = uStack_243a;
            auVar113._0_8_ = auVar93._0_8_;
            auVar113._8_4_ = auVar44._0_4_;
            auVar113._12_4_ = auVar45._0_4_;
            auVar115._0_8_ = auVar103._0_8_;
            auVar115._8_4_ = auVar46._0_4_;
            auVar115._12_4_ = auVar47._0_4_;
            auVar123._8_4_ = (int)((ulong)auVar77._0_8_ >> 0x20);
            auVar123._0_8_ = auVar77._0_8_;
            auVar123._12_4_ = (int)((ulong)auVar109._0_8_ >> 0x20);
            auVar130._8_4_ = (int)((ulong)auVar84._0_8_ >> 0x20);
            auVar130._0_8_ = auVar84._0_8_;
            auVar130._12_4_ = (int)((ulong)auVar126._0_8_ >> 0x20);
            local_2038[uVar56 * 0x10 + lVar59 * 2] =
                 CONCAT44(CONCAT22(local_2488,local_2498._0_2_),auVar93._0_4_);
            (local_2038 + uVar56 * 0x10 + lVar59 * 2)[1] =
                 CONCAT44(CONCAT22(local_2448,local_2458._0_2_),auVar103._0_4_);
            local_2038[uVar56 * 0x10 + lVar59 * 2 + 2] = auVar113._8_8_;
            (local_2038 + uVar56 * 0x10 + lVar59 * 2 + 2)[1] = auVar115._8_8_;
            puVar1 = local_2018 + uVar56 * 0x20 + lVar59 * 4;
            *puVar1 = auVar94._8_4_;
            puVar1[1] = auVar119._8_4_;
            puVar1[2] = auVar104._8_4_;
            puVar1[3] = auVar134._8_4_;
            local_2018[uVar56 * 0x20 + lVar59 * 4 + 6] = auVar95._12_4_;
            local_2018[uVar56 * 0x20 + lVar59 * 4 + 7] = auVar120._12_4_;
            *(undefined4 *)(&local_1ff8 + uVar56 * 0x10 + lVar59 * 2) = auVar105._12_4_;
            *(undefined4 *)((long)auStack_1ff0 + lVar59 * 0x10 + uVar56 * 0x80 + -4) =
                 auVar135._12_4_;
            (&local_1ff8)[uVar56 * 0x10 + lVar59 * 2] = CONCAT44(uVar107,uVar75);
            (&local_1ff8 + uVar56 * 0x10 + lVar59 * 2)[1] = CONCAT44(uVar124,uVar82);
            auStack_1ff0[uVar56 * 0x10 + lVar59 * 2 + 1] = auVar123._8_8_;
            (auStack_1ff0 + uVar56 * 0x10 + lVar59 * 2 + 1)[1] = auVar130._8_8_;
            puVar1 = local_1fd8 + uVar56 * 0x20 + lVar59 * 4;
            *puVar1 = auVar77._8_4_;
            puVar1[1] = auVar109._8_4_;
            puVar1[2] = auVar84._8_4_;
            puVar1[3] = auVar126._8_4_;
            auStack_1fc0[uVar56 * 0x20 + lVar59 * 4] = auVar98._12_4_;
            auStack_1fc0[uVar56 * 0x20 + lVar59 * 4 + 1] = auVar111._12_4_;
            auStack_1fc0[uVar56 * 0x20 + lVar59 * 4 + 2] = auVar86._12_4_;
            auStack_1fc0[uVar56 * 0x20 + lVar59 * 4 + 3] = auVar128._12_4_;
            uVar62 = uVar62 + 1;
            palVar54 = palVar54 + 8;
          } while (uVar62 != uVar63);
        }
      }
      else if (0 < (int)uVar68) {
        lVar59 = 0;
        puVar55 = puVar73;
        do {
          auVar78 = *(undefined1 (*) [16])((long)local_2438 + lVar59);
          auVar98 = *(undefined1 (*) [16])((long)auStack_2428 + lVar59 + 0x10);
          auVar92._0_12_ = auVar78._0_12_;
          auVar92._12_2_ = auVar78._6_2_;
          auVar92._14_2_ = *(undefined2 *)((long)auStack_2428 + lVar59 + 6);
          auVar91._12_4_ = auVar92._12_4_;
          auVar91._0_10_ = auVar78._0_10_;
          auVar91._10_2_ = *(undefined2 *)((long)auStack_2428 + lVar59 + 4);
          auVar90._10_6_ = auVar91._10_6_;
          auVar90._0_8_ = auVar78._0_8_;
          auVar90._8_2_ = auVar78._4_2_;
          auVar40._4_8_ = auVar90._8_8_;
          auVar40._2_2_ = *(undefined2 *)((long)auStack_2428 + lVar59 + 2);
          auVar40._0_2_ = auVar78._2_2_;
          auVar89._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_2428 + lVar59),auVar78._0_2_);
          auVar89._4_12_ = auVar40;
          auVar118._0_12_ = auVar98._0_12_;
          auVar118._12_2_ = auVar98._6_2_;
          auVar118._14_2_ = *(undefined2 *)((long)auStack_2408 + lVar59 + 6);
          auVar117._12_4_ = auVar118._12_4_;
          auVar117._0_10_ = auVar98._0_10_;
          auVar117._10_2_ = *(undefined2 *)((long)auStack_2408 + lVar59 + 4);
          auVar116._10_6_ = auVar117._10_6_;
          auVar116._0_8_ = auVar98._0_8_;
          auVar116._8_2_ = auVar98._4_2_;
          auVar41._4_8_ = auVar116._8_8_;
          auVar41._2_2_ = *(undefined2 *)((long)auStack_2408 + lVar59 + 2);
          auVar41._0_2_ = auVar98._2_2_;
          auVar86 = *(undefined1 (*) [16])((long)auStack_2408 + lVar59 + 0x10);
          auVar102._0_12_ = auVar86._0_12_;
          auVar102._12_2_ = auVar86._6_2_;
          auVar102._14_2_ = *(undefined2 *)((long)auStack_23e8 + lVar59 + 6);
          auVar101._12_4_ = auVar102._12_4_;
          auVar101._0_10_ = auVar86._0_10_;
          auVar101._10_2_ = *(undefined2 *)((long)auStack_23e8 + lVar59 + 4);
          auVar100._10_6_ = auVar101._10_6_;
          auVar100._0_8_ = auVar86._0_8_;
          auVar100._8_2_ = auVar86._4_2_;
          auVar42._4_8_ = auVar100._8_8_;
          auVar42._2_2_ = *(undefined2 *)((long)auStack_23e8 + lVar59 + 2);
          auVar42._0_2_ = auVar86._2_2_;
          auVar99._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_23e8 + lVar59),auVar86._0_2_);
          auVar99._4_12_ = auVar42;
          auVar96 = *(undefined1 (*) [16])((long)auStack_23e8 + lVar59 + 0x10);
          uVar38 = *(undefined2 *)((long)auStack_23c8 + lVar59);
          auVar133._0_12_ = auVar96._0_12_;
          auVar133._12_2_ = auVar96._6_2_;
          auVar133._14_2_ = *(undefined2 *)((long)auStack_23c8 + lVar59 + 6);
          auVar132._12_4_ = auVar133._12_4_;
          auVar132._0_10_ = auVar96._0_10_;
          auVar132._10_2_ = *(undefined2 *)((long)auStack_23c8 + lVar59 + 4);
          auVar131._10_6_ = auVar132._10_6_;
          auVar131._0_8_ = auVar96._0_8_;
          auVar131._8_2_ = auVar96._4_2_;
          auVar43._4_8_ = auVar131._8_8_;
          auVar43._2_2_ = *(undefined2 *)((long)auStack_23c8 + lVar59 + 2);
          auVar43._0_2_ = auVar96._2_2_;
          uVar75 = CONCAT22(*(undefined2 *)((long)auStack_2428 + lVar59 + 8),auVar78._8_2_);
          auVar76._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_2428 + lVar59 + 10),
                        CONCAT24(auVar78._10_2_,uVar75));
          auVar76._8_2_ = auVar78._12_2_;
          auVar76._10_2_ = *(undefined2 *)((long)auStack_2428 + lVar59 + 0xc);
          auVar80._12_2_ = auVar78._14_2_;
          auVar80._0_12_ = auVar76;
          auVar80._14_2_ = *(undefined2 *)((long)auStack_2428 + lVar59 + 0xe);
          uVar107 = CONCAT22(*(undefined2 *)((long)auStack_2408 + lVar59 + 8),auVar98._8_2_);
          auVar108._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_2408 + lVar59 + 10),
                        CONCAT24(auVar98._10_2_,uVar107));
          auVar108._8_2_ = auVar98._12_2_;
          auVar108._10_2_ = *(undefined2 *)((long)auStack_2408 + lVar59 + 0xc);
          auVar110._12_2_ = auVar98._14_2_;
          auVar110._0_12_ = auVar108;
          auVar110._14_2_ = *(undefined2 *)((long)auStack_2408 + lVar59 + 0xe);
          uVar82 = CONCAT22(*(undefined2 *)((long)auStack_23e8 + lVar59 + 8),auVar86._8_2_);
          auVar83._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_23e8 + lVar59 + 10),
                        CONCAT24(auVar86._10_2_,uVar82));
          auVar83._8_2_ = auVar86._12_2_;
          auVar83._10_2_ = *(undefined2 *)((long)auStack_23e8 + lVar59 + 0xc);
          auVar85._12_2_ = auVar86._14_2_;
          auVar85._0_12_ = auVar83;
          auVar85._14_2_ = *(undefined2 *)((long)auStack_23e8 + lVar59 + 0xe);
          uVar124 = CONCAT22(*(undefined2 *)((long)auStack_23c8 + lVar59 + 8),auVar96._8_2_);
          auVar125._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_23c8 + lVar59 + 10),
                        CONCAT24(auVar96._10_2_,uVar124));
          auVar125._8_2_ = auVar96._12_2_;
          auVar125._10_2_ = *(undefined2 *)((long)auStack_23c8 + lVar59 + 0xc);
          auVar127._12_2_ = auVar96._14_2_;
          auVar127._0_12_ = auVar125;
          auVar127._14_2_ = *(undefined2 *)((long)auStack_23c8 + lVar59 + 0xe);
          auVar112._0_8_ = auVar89._0_8_;
          auVar112._8_4_ = auVar40._0_4_;
          auVar112._12_4_ = auVar41._0_4_;
          auVar114._0_8_ = auVar99._0_8_;
          auVar114._8_4_ = auVar42._0_4_;
          auVar114._12_4_ = auVar43._0_4_;
          auVar122._8_4_ = (int)((ulong)auVar76._0_8_ >> 0x20);
          auVar122._0_8_ = auVar76._0_8_;
          auVar122._12_4_ = (int)((ulong)auVar108._0_8_ >> 0x20);
          auVar129._8_4_ = (int)((ulong)auVar83._0_8_ >> 0x20);
          auVar129._0_8_ = auVar83._0_8_;
          auVar129._12_4_ = (int)((ulong)auVar125._0_8_ >> 0x20);
          *(ulong *)(puVar55 + -0x70) =
               CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_2408 + lVar59),auVar98._0_2_),
                        auVar89._0_4_);
          *(ulong *)(puVar55 + -0x68) = CONCAT44(CONCAT22(uVar38,auVar96._0_2_),auVar99._0_4_);
          *(long *)(puVar55 + -0x60) = auVar112._8_8_;
          *(long *)(puVar55 + -0x58) = auVar114._8_8_;
          *(int *)(puVar55 + -0x50) = auVar90._8_4_;
          *(int *)(puVar55 + -0x4c) = auVar116._8_4_;
          *(int *)(puVar55 + -0x48) = auVar100._8_4_;
          *(int *)(puVar55 + -0x44) = auVar131._8_4_;
          *(undefined4 *)(puVar55 + -0x38) = auVar91._12_4_;
          *(undefined4 *)(puVar55 + -0x34) = auVar117._12_4_;
          *(undefined4 *)(puVar55 + -0x30) = auVar101._12_4_;
          *(undefined4 *)(puVar55 + -0x2c) = auVar132._12_4_;
          *(ulong *)(puVar55 + -0x30) = CONCAT44(uVar107,uVar75);
          *(ulong *)(puVar55 + -0x28) = CONCAT44(uVar124,uVar82);
          *(long *)(puVar55 + -0x20) = auVar122._8_8_;
          *(long *)(puVar55 + -0x18) = auVar129._8_8_;
          *(int *)(puVar55 + -0x10) = auVar76._8_4_;
          *(int *)(puVar55 + -0xc) = auVar108._8_4_;
          *(int *)(puVar55 + -8) = auVar83._8_4_;
          *(int *)(puVar55 + -4) = auVar125._8_4_;
          *(int *)(puVar55 + 8) = auVar80._12_4_;
          *(int *)(puVar55 + 0xc) = auVar110._12_4_;
          *(int *)(puVar55 + 0x10) = auVar85._12_4_;
          *(int *)(puVar55 + 0x14) = auVar127._12_4_;
          lVar59 = lVar59 + 0x80;
          puVar55 = puVar55 + lVar60 * 0x10;
        } while (uVar63 << 7 != lVar59);
      }
      uVar56 = local_24c8 + 1;
      pauVar61 = local_24c0[0] + 2;
      puVar73 = puVar73 + 0x80;
    } while (uVar56 != uVar66);
  }
  if (0 < (int)uVar68) {
    pauVar61 = (undefined1 (*) [16])local_2038;
    uVar56 = 0;
    do {
      (*p_Var6)((__m128i *)(local_2038 + uVar56 * lVar60 * 2),
                (__m128i *)(local_2038 + uVar56 * lVar60 * 2));
      cVar2 = pcVar5[1];
      if (cVar2 < 0) {
        auVar78 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
        auVar78 = pshuflw(auVar78,auVar78,0);
        auVar81._0_4_ = auVar78._0_4_;
        auVar81._4_4_ = auVar81._0_4_;
        auVar81._8_4_ = auVar81._0_4_;
        auVar81._12_4_ = auVar81._0_4_;
        pauVar57 = pauVar61;
        uVar62 = uVar72;
        do {
          auVar78 = pmulhrsw(*pauVar57,auVar81);
          *pauVar57 = auVar78;
          pauVar57 = pauVar57 + 1;
          uVar62 = uVar62 - 1;
        } while (uVar62 != 0);
      }
      else if (cVar2 != '\0') {
        pauVar57 = pauVar61;
        uVar62 = uVar72;
        do {
          auVar78 = psllw(*pauVar57,ZEXT416((uint)(int)cVar2));
          *pauVar57 = auVar78;
          pauVar57 = pauVar57 + 1;
          uVar62 = uVar62 - 1;
        } while (uVar62 != 0);
      }
      uVar56 = uVar56 + 1;
      pauVar61 = pauVar61 + lVar60;
    } while (uVar56 != uVar63);
  }
  local_2514 = (byte)uVar67;
  if ((0x75f1cUL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    if ((0x80c2UL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      uVar63 = 0;
      if (!bVar74 && (uVar67 & 1) == 0) {
        uVar63 = (ulong)(uVar4 - 1);
      }
      pauVar61 = (undefined1 (*) [16])(local_2038 + uVar63 * 2);
      do {
        uVar63 = *(ulong *)output;
        auVar24._8_6_ = 0;
        auVar24._0_8_ = uVar63;
        auVar24[0xe] = (char)(uVar63 >> 0x38);
        auVar26._8_4_ = 0;
        auVar26._0_8_ = uVar63;
        auVar26[0xc] = (char)(uVar63 >> 0x30);
        auVar26._13_2_ = auVar24._13_2_;
        auVar28._8_4_ = 0;
        auVar28._0_8_ = uVar63;
        auVar28._12_3_ = auVar26._12_3_;
        auVar30._8_2_ = 0;
        auVar30._0_8_ = uVar63;
        auVar30[10] = (char)(uVar63 >> 0x28);
        auVar30._11_4_ = auVar28._11_4_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar63;
        auVar32._10_5_ = auVar30._10_5_;
        auVar34[8] = (char)(uVar63 >> 0x20);
        auVar34._0_8_ = uVar63;
        auVar34._9_6_ = auVar32._9_6_;
        auVar48._7_8_ = 0;
        auVar48._0_7_ = auVar34._8_7_;
        auVar50._1_8_ = SUB158(auVar48 << 0x40,7);
        auVar50[0] = (char)(uVar63 >> 0x18);
        auVar50._9_6_ = 0;
        auVar51._1_10_ = SUB1510(auVar50 << 0x30,5);
        auVar51[0] = (char)(uVar63 >> 0x10);
        auVar51._11_4_ = 0;
        auVar36[2] = (char)(uVar63 >> 8);
        auVar36._0_2_ = (ushort)uVar63;
        auVar36._3_12_ = SUB1512(auVar51 << 0x20,3);
        auVar87._0_2_ = (ushort)uVar63 & 0xff;
        auVar87._2_13_ = auVar36._2_13_;
        auVar87[0xf] = 0;
        auVar78 = paddsw(auVar87,*pauVar61);
        sVar8 = auVar78._0_2_;
        sVar9 = auVar78._2_2_;
        sVar10 = auVar78._4_2_;
        sVar11 = auVar78._6_2_;
        sVar12 = auVar78._8_2_;
        sVar13 = auVar78._10_2_;
        sVar14 = auVar78._12_2_;
        sVar15 = auVar78._14_2_;
        *(ulong *)output =
             CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar78[0xe] - (0xff < sVar15),
                      CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar78[0xc] - (0xff < sVar14),
                               CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar78[10] -
                                        (0xff < sVar13),
                                        CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar78[8] -
                                                 (0xff < sVar12),
                                                 CONCAT13((0 < sVar11) * (sVar11 < 0x100) *
                                                          auVar78[6] - (0xff < sVar11),
                                                          CONCAT12((0 < sVar10) * (sVar10 < 0x100) *
                                                                   auVar78[4] - (0xff < sVar10),
                                                                   CONCAT11((0 < sVar9) *
                                                                            (sVar9 < 0x100) *
                                                                            auVar78[2] -
                                                                            (0xff < sVar9),
                                                                            (0 < sVar8) *
                                                                            (sVar8 < 0x100) *
                                                                            auVar78[0] -
                                                                            (0xff < sVar8))))))));
        output = (uint8_t *)((long)output + (long)stride);
        pauVar61 = (undefined1 (*) [16])(pauVar61[-1] + (((bVar74 | local_2514) & 1) << 5));
        uVar72 = uVar72 - 1;
      } while (uVar72 != 0);
    }
  }
  else if ((0xa0e3UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    uVar56 = 0;
    uVar63 = (ulong)(uVar4 - 1);
    if (bVar74 || (uVar67 & 1) != 0) {
      uVar63 = uVar56;
    }
    uVar62 = 0;
    do {
      pauVar57 = (undefined1 (*) [16])(local_2038 + uVar63 * 2 + (long)(int)uVar56 * 2);
      uVar65 = uVar72;
      pauVar61 = (undefined1 (*) [16])output;
      do {
        auVar78 = *pauVar61;
        auVar25[0xd] = 0;
        auVar25._0_13_ = auVar78._0_13_;
        auVar25[0xe] = auVar78[7];
        auVar27[0xc] = auVar78[6];
        auVar27._0_12_ = auVar78._0_12_;
        auVar27._13_2_ = auVar25._13_2_;
        auVar29[0xb] = 0;
        auVar29._0_11_ = auVar78._0_11_;
        auVar29._12_3_ = auVar27._12_3_;
        auVar31[10] = auVar78[5];
        auVar31._0_10_ = auVar78._0_10_;
        auVar31._11_4_ = auVar29._11_4_;
        auVar33[9] = 0;
        auVar33._0_9_ = auVar78._0_9_;
        auVar33._10_5_ = auVar31._10_5_;
        auVar35[8] = auVar78[4];
        auVar35._0_8_ = auVar78._0_8_;
        auVar35._9_6_ = auVar33._9_6_;
        auVar49._7_8_ = 0;
        auVar49._0_7_ = auVar35._8_7_;
        auVar52._1_8_ = SUB158(auVar49 << 0x40,7);
        auVar52[0] = auVar78[3];
        auVar52._9_6_ = 0;
        auVar53._1_10_ = SUB1510(auVar52 << 0x30,5);
        auVar53[0] = auVar78[2];
        auVar53._11_4_ = 0;
        auVar37[2] = auVar78[1];
        auVar37._0_2_ = auVar78._0_2_;
        auVar37._3_12_ = SUB1512(auVar53 << 0x20,3);
        auVar97._0_2_ = auVar78._0_2_ & 0xff;
        auVar97._2_13_ = auVar37._2_13_;
        auVar97[0xf] = 0;
        auVar98 = paddsw(auVar97,*pauVar57);
        auVar88[1] = 0;
        auVar88[0] = auVar78[8];
        auVar88[2] = auVar78[9];
        auVar88[3] = 0;
        auVar88[4] = auVar78[10];
        auVar88[5] = 0;
        auVar88[6] = auVar78[0xb];
        auVar88[7] = 0;
        auVar88[8] = auVar78[0xc];
        auVar88[9] = 0;
        auVar88[10] = auVar78[0xd];
        auVar88[0xb] = 0;
        auVar88[0xc] = auVar78[0xe];
        auVar88[0xd] = 0;
        auVar88[0xe] = auVar78[0xf];
        auVar88[0xf] = 0;
        auVar78 = paddsw(auVar88,pauVar57[uVar72]);
        sVar8 = auVar98._0_2_;
        sVar9 = auVar98._2_2_;
        sVar10 = auVar98._4_2_;
        sVar11 = auVar98._6_2_;
        sVar12 = auVar98._8_2_;
        sVar13 = auVar98._10_2_;
        sVar14 = auVar98._12_2_;
        sVar15 = auVar98._14_2_;
        sVar16 = auVar78._0_2_;
        sVar17 = auVar78._2_2_;
        sVar18 = auVar78._4_2_;
        sVar19 = auVar78._6_2_;
        sVar20 = auVar78._8_2_;
        sVar21 = auVar78._10_2_;
        sVar22 = auVar78._12_2_;
        sVar23 = auVar78._14_2_;
        (*pauVar61)[0] = (0 < sVar8) * (sVar8 < 0x100) * auVar98[0] - (0xff < sVar8);
        (*pauVar61)[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar98[2] - (0xff < sVar9);
        (*pauVar61)[2] = (0 < sVar10) * (sVar10 < 0x100) * auVar98[4] - (0xff < sVar10);
        (*pauVar61)[3] = (0 < sVar11) * (sVar11 < 0x100) * auVar98[6] - (0xff < sVar11);
        (*pauVar61)[4] = (0 < sVar12) * (sVar12 < 0x100) * auVar98[8] - (0xff < sVar12);
        (*pauVar61)[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar98[10] - (0xff < sVar13);
        (*pauVar61)[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar98[0xc] - (0xff < sVar14);
        (*pauVar61)[7] = (0 < sVar15) * (sVar15 < 0x100) * auVar98[0xe] - (0xff < sVar15);
        (*pauVar61)[8] = (0 < sVar16) * (sVar16 < 0x100) * auVar78[0] - (0xff < sVar16);
        (*pauVar61)[9] = (0 < sVar17) * (sVar17 < 0x100) * auVar78[2] - (0xff < sVar17);
        (*pauVar61)[10] = (0 < sVar18) * (sVar18 < 0x100) * auVar78[4] - (0xff < sVar18);
        (*pauVar61)[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar78[6] - (0xff < sVar19);
        (*pauVar61)[0xc] = (0 < sVar20) * (sVar20 < 0x100) * auVar78[8] - (0xff < sVar20);
        (*pauVar61)[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar78[10] - (0xff < sVar21);
        (*pauVar61)[0xe] = (0 < sVar22) * (sVar22 < 0x100) * auVar78[0xc] - (0xff < sVar22);
        (*pauVar61)[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar78[0xe] - (0xff < sVar23);
        pauVar61 = (undefined1 (*) [16])(*pauVar61 + stride);
        pauVar57 = (undefined1 (*) [16])(pauVar57[-1] + (((bVar74 | local_2514) & 1) << 5));
        uVar65 = uVar65 - 1;
      } while (uVar65 != 0);
      uVar62 = uVar62 + 1;
      output = (uint8_t *)((long)output + 0x10);
      uVar56 = (ulong)((int)uVar56 + uVar4 * 2);
    } while (uVar62 != (uVar3 >> 4) + (uint)(uVar3 >> 4 == 0));
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_no_identity_ssse3(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  __m128i buf1[64 * 8];
  int eobx, eoby;
  get_eobx_eoby_scan_default(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int buf_size_nonzero_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx_x = lowbd_txfm_all_1d_zeros_idx[eobx];
  const int fun_idx_y = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx_x];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx_y];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_nonzero_h_div8; i++) {
    __m128i buf0[64];
    load_buffer_32bit_to_16bit(input + 8 * i, input_stride, buf0,
                               buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_ssse3(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_ssse3(buf0, txfm_size_col, shift[0]);
    __m128i *_buf1 = buf1 + i * 8;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        __m128i temp[8];
        flip_buf_sse2(buf0 + 8 * j, temp, 8);
        transpose_16bit_8x8(temp,
                            _buf1 + txfm_size_row * (buf_size_w_div8 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_16bit_8x8(buf0 + 8 * j, _buf1 + txfm_size_row * j);
      }
    }
  }
  for (int i = 0; i < buf_size_w_div8; i++) {
    col_txfm(buf1 + i * txfm_size_row, buf1 + i * txfm_size_row);
    round_shift_16bit_ssse3(buf1 + i * txfm_size_row, txfm_size_row, shift[1]);
  }

  if (txfm_size_col >= 16) {
    for (int i = 0; i < (txfm_size_col >> 4); i++) {
      lowbd_write_buffer_16xn_sse2(buf1 + i * txfm_size_row * 2,
                                   output + 16 * i, stride, ud_flip,
                                   txfm_size_row);
    }
  } else if (txfm_size_col == 8) {
    lowbd_write_buffer_8xn_sse2(buf1, output, stride, ud_flip, txfm_size_row);
  }
}